

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O0

Gia_Man_t * Gia_SweeperCleanup(Gia_Man_t *p,char *pCommLime)

{
  Gia_Man_t *p_00;
  Vec_Int_t *p_01;
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Abc_Frame_t *pAVar6;
  sat_solver *psVar7;
  abctime aVar8;
  bool bVar9;
  int local_4c;
  uint local_48;
  int ProbeId;
  int iLit;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vObjIds;
  Swp_Man_t *pSwp;
  char *pCommLime_local;
  Gia_Man_t *p_local;
  
  vObjIds = (Vec_Int_t *)p->pData;
  pSwp = (Swp_Man_t *)pCommLime;
  pCommLime_local = (char *)p;
  Gia_ManIncrementTravId(p);
  pNew = (Gia_Man_t *)Vec_IntAlloc(1000);
  for (local_4c = 0; iVar1 = Vec_IntSize(*(Vec_Int_t **)(vObjIds + 1)), local_4c < iVar1;
      local_4c = local_4c + 1) {
    local_48 = Vec_IntEntry(*(Vec_Int_t **)(vObjIds + 1),local_4c);
    if (-1 < (int)local_48) {
      _iLit = Gia_Lit2Obj((Gia_Man_t *)pCommLime_local,local_48);
      pcVar4 = pCommLime_local;
      pGVar5 = Gia_Regular(_iLit);
      Gia_ManExtract_rec((Gia_Man_t *)pcVar4,pGVar5,(Vec_Int_t *)pNew);
    }
  }
  iVar1 = Gia_ManPiNum((Gia_Man_t *)pCommLime_local);
  iVar2 = Vec_IntSize((Vec_Int_t *)pNew);
  pTemp = Gia_ManStart(iVar1 + iVar2 + 0x65);
  pcVar4 = Abc_UtilStrsav(*(char **)pCommLime_local);
  pTemp->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(*(char **)(pCommLime_local + 8));
  pTemp->pSpec = pcVar4;
  pGVar5 = Gia_ManConst0((Gia_Man_t *)pCommLime_local);
  pGVar5->Value = 0;
  ProbeId = 0;
  while( true ) {
    iVar1 = ProbeId;
    iVar2 = Gia_ManPiNum((Gia_Man_t *)pCommLime_local);
    bVar9 = false;
    if (iVar1 < iVar2) {
      _iLit = Gia_ManCi((Gia_Man_t *)pCommLime_local,ProbeId);
      bVar9 = _iLit != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    uVar3 = Gia_ManAppendCi(pTemp);
    _iLit->Value = uVar3;
    ProbeId = ProbeId + 1;
  }
  Gia_ManHashStart(pTemp);
  ProbeId = 0;
  while( true ) {
    iVar1 = ProbeId;
    iVar2 = Vec_IntSize((Vec_Int_t *)pNew);
    pcVar4 = pCommLime_local;
    bVar9 = false;
    if (iVar1 < iVar2) {
      iVar1 = Vec_IntEntry((Vec_Int_t *)pNew,ProbeId);
      _iLit = Gia_ManObj((Gia_Man_t *)pcVar4,iVar1);
      bVar9 = _iLit != (Gia_Obj_t *)0x0;
    }
    p_00 = pTemp;
    if (!bVar9) break;
    iVar1 = Gia_ObjFanin0Copy(_iLit);
    iVar2 = Gia_ObjFanin1Copy(_iLit);
    uVar3 = Gia_ManHashAnd(p_00,iVar1,iVar2);
    _iLit->Value = uVar3;
    ProbeId = ProbeId + 1;
  }
  Gia_ManHashStop(pTemp);
  for (local_4c = 0; iVar1 = Vec_IntSize(*(Vec_Int_t **)(vObjIds + 1)), local_4c < iVar1;
      local_4c = local_4c + 1) {
    local_48 = Vec_IntEntry(*(Vec_Int_t **)(vObjIds + 1),local_4c);
    if (-1 < (int)local_48) {
      _iLit = Gia_Lit2Obj((Gia_Man_t *)pCommLime_local,local_48);
      pGVar5 = Gia_Regular(_iLit);
      uVar3 = pGVar5->Value;
      local_48 = Gia_IsComplement(_iLit);
      local_48 = uVar3 ^ local_48;
      Vec_IntWriteEntry(*(Vec_Int_t **)(vObjIds + 1),local_4c,local_48);
    }
  }
  Vec_IntFree((Vec_Int_t *)pNew);
  iVar1 = Gia_ManHasDangling(pTemp);
  if (iVar1 != 0) {
    pObj = (Gia_Obj_t *)pTemp;
    pTemp = Gia_ManCleanup(pTemp);
    Gia_ManStop((Gia_Man_t *)pObj);
  }
  if (pSwp != (Swp_Man_t *)0x0) {
    pAVar6 = Abc_FrameGetGlobalFrame();
    Abc_FrameUpdateGia(pAVar6,pTemp);
    pAVar6 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar6,(char *)pSwp);
    pAVar6 = Abc_FrameGetGlobalFrame();
    pTemp = Abc_FrameGetGia(pAVar6);
  }
  Vec_IntClear(*(Vec_Int_t **)(vObjIds + 3));
  sat_solver_delete((sat_solver *)vObjIds[2].pArray);
  psVar7 = sat_solver_new();
  vObjIds[2].pArray = &psVar7->size;
  *(undefined4 *)&vObjIds[5].pArray = 1;
  sat_solver_setnvars((sat_solver *)vObjIds[2].pArray,1000);
  p_01 = vObjIds;
  iVar1 = *(int *)&vObjIds[5].pArray;
  *(int *)&vObjIds[5].pArray = iVar1 + 1;
  local_48 = Abc_Var2Lit(iVar1,0);
  Swp_ManSetObj2Lit((Swp_Man_t *)p_01,0,local_48);
  local_48 = Abc_LitNot(local_48);
  sat_solver_addclause((sat_solver *)vObjIds[2].pArray,(lit *)&local_48,&ProbeId);
  aVar8 = Abc_Clock();
  vObjIds[7].nCap = (int)aVar8;
  vObjIds[7].nSize = (int)((ulong)aVar8 >> 0x20);
  pTemp->pData = *(void **)(pCommLime_local + 0x278);
  pCommLime_local[0x278] = '\0';
  pCommLime_local[0x279] = '\0';
  pCommLime_local[0x27a] = '\0';
  pCommLime_local[0x27b] = '\0';
  pCommLime_local[0x27c] = '\0';
  pCommLime_local[0x27d] = '\0';
  pCommLime_local[0x27e] = '\0';
  pCommLime_local[0x27f] = '\0';
  Gia_ManStop((Gia_Man_t *)pCommLime_local);
  return pTemp;
}

Assistant:

Gia_Man_t * Gia_SweeperCleanup( Gia_Man_t * p, char * pCommLime )
{
    Swp_Man_t * pSwp = (Swp_Man_t *)p->pData;
    Vec_Int_t * vObjIds;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iLit, ProbeId;

    // collect all internal nodes pointed to by currently-used probes
    Gia_ManIncrementTravId( p );
    vObjIds = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( pSwp->vProbes, iLit, ProbeId )
    {
        if ( iLit < 0 ) continue;
        pObj = Gia_Lit2Obj( p, iLit );
        Gia_ManExtract_rec( p, Gia_Regular(pObj), vObjIds );
    }
    // create new manager
    pNew = Gia_ManStart( 1 + Gia_ManPiNum(p) + Vec_IntSize(vObjIds) + 100 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create internal nodes
    Gia_ManHashStart( pNew );
    Gia_ManForEachObjVec( vObjIds, p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManHashStop( pNew );
    // create outputs
    Vec_IntForEachEntry( pSwp->vProbes, iLit, ProbeId )
    {
        if ( iLit < 0 ) continue;
        pObj = Gia_Lit2Obj( p, iLit );
        iLit = Gia_Regular(pObj)->Value ^ Gia_IsComplement(pObj);
        Vec_IntWriteEntry( pSwp->vProbes, ProbeId, iLit );
    }
    Vec_IntFree( vObjIds );
    // duplicate if needed
    if ( Gia_ManHasDangling(pNew) )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    // execute command line
    if ( pCommLime )
    {
        // set pNew to be current GIA in ABC
        Abc_FrameUpdateGia( Abc_FrameGetGlobalFrame(), pNew );
        // execute command line pCommLine using Abc_CmdCommandExecute()
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), pCommLime );
        // get pNew to be current GIA in ABC     
        pNew = Abc_FrameGetGia( Abc_FrameGetGlobalFrame() );
    }
    // restart the SAT solver
    Vec_IntClear( pSwp->vId2Lit );
    sat_solver_delete( pSwp->pSat );
    pSwp->pSat         = sat_solver_new();
    pSwp->nSatVars     = 1;
    sat_solver_setnvars( pSwp->pSat, 1000 );
    Swp_ManSetObj2Lit( pSwp, 0, (iLit = Abc_Var2Lit(pSwp->nSatVars++, 0)) );
    iLit = Abc_LitNot(iLit);
    sat_solver_addclause( pSwp->pSat, &iLit, &iLit + 1 );
    pSwp->timeStart    = Abc_Clock();
    // return the result
    pNew->pData = p->pData; p->pData = NULL;
    Gia_ManStop( p );
    return pNew;
}